

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

string * opts::OptionContainer<char[512]>::default_value_abi_cxx11_(char (*def) [512])

{
  char *in_RSI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static
    std::string     default_value(const T& def)
    {
        std::ostringstream oss;
        oss << def;
        return oss.str();
    }